

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

void __thiscall
TPZFNMatrix<3,_Fad<long_double>_>::TPZFNMatrix
          (TPZFNMatrix<3,_Fad<long_double>_> *this,TPZFNMatrix<3,_Fad<long_double>_> *copy)

{
  Fad<long_double> *buf;
  long lVar1;
  
  (this->super_TPZFMatrix<Fad<long_double>_>).super_TPZMatrix<Fad<long_double>_>.super_TPZBaseMatrix
  .super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01687448;
  buf = this->fBuf;
  lVar1 = 0;
  TPZFMatrix<Fad<long_double>_>::TPZFMatrix
            (&this->super_TPZFMatrix<Fad<long_double>_>,&PTR_PTR_01687700,0,0,buf,3);
  (this->super_TPZFMatrix<Fad<long_double>_>).super_TPZMatrix<Fad<long_double>_>.super_TPZBaseMatrix
  .super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01687448;
  do {
    Fad<long_double>::Fad(buf);
    lVar1 = lVar1 + -0x30;
    buf = buf + 1;
  } while (lVar1 != -0xc0);
  TPZFMatrix<Fad<long_double>_>::operator=
            (&this->super_TPZFMatrix<Fad<long_double>_>,&copy->super_TPZFMatrix<Fad<long_double>_>);
  return;
}

Assistant:

inline TPZFNMatrix(const TPZFNMatrix<N,TVar> &copy) : TPZRegisterClassId(&TPZFNMatrix<N,TVar>::ClassId), 
    TPZFMatrix<TVar>(0,0,fBuf,N)
    {
        *this = copy;
    }